

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive>::build
          (BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  BVH *pBVar5;
  pointer ppTVar6;
  Device *pDVar7;
  Block *pBVar8;
  PrimRef *pPVar9;
  MemoryMonitorInterface *pMVar10;
  Geometry *pGVar11;
  Scene *pSVar12;
  GTypeMask GVar13;
  BVHN<4> *this_00;
  double dVar14;
  undefined8 uVar15;
  long lVar16;
  long *plVar17;
  PrimRef *pPVar18;
  NodeRef root;
  ulong uVar19;
  uint uVar20;
  long *plVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  ulong uVar23;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *prims;
  __pointer_type pBVar24;
  pointer ppTVar25;
  ulong uVar26;
  size_t sVar27;
  float fVar28;
  double t0;
  undefined1 auVar29 [16];
  PrimInfo pinfo;
  string __str;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  long local_a8;
  long local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar5 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar5->alloc);
    ppTVar6 = (pBVar5->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar25 = (pBVar5->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar25 != ppTVar6;
        ppTVar25 = ppTVar25 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar25,&pBVar5->alloc);
    }
    ppTVar25 = (pBVar5->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar5->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar25) {
      (pBVar5->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar25;
    }
    LOCK();
    (pBVar5->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar5->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar5->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar5->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar7 = (pBVar5->alloc).device;
      bVar4 = (pBVar5->alloc).useUSM;
      pBVar24 = (pBVar5->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar8 = pBVar24->next;
        FastAllocator::Block::clear_block(pBVar24,pDVar7,bVar4);
        pBVar24 = pBVar8;
      } while (pBVar8 != (Block *)0x0);
    }
    LOCK();
    (pBVar5->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar5->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar7 = (pBVar5->alloc).device;
      bVar4 = (pBVar5->alloc).useUSM;
      pBVar24 = (pBVar5->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar8 = pBVar24->next;
        FastAllocator::Block::clear_block(pBVar24,pDVar7,bVar4);
        pBVar24 = pBVar8;
      } while (pBVar8 != (Block *)0x0);
    }
    LOCK();
    (pBVar5->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar16 = -8;
    do {
      LOCK();
      (pBVar5->alloc).threadBlocks[lVar16]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).threadBlocks[lVar16 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0);
    sVar27 = (pBVar5->alloc).primrefarray.size_alloced;
    pPVar9 = (pBVar5->alloc).primrefarray.items;
    if (pPVar9 != (PrimRef *)0x0) {
      if (sVar27 << 5 < 0x1c00000) {
        alignedFree(pPVar9);
      }
      else {
        os_free(pPVar9,sVar27 << 5,(pBVar5->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar27 != 0) {
      pMVar10 = (pBVar5->alloc).primrefarray.alloc.device;
      (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
    }
    (pBVar5->alloc).primrefarray.size_active = 0;
    (pBVar5->alloc).primrefarray.size_alloced = 0;
    (pBVar5->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar11 = this->mesh;
  if (pGVar11 == (Geometry *)0x0) {
    pSVar12 = this->scene;
    GVar13 = this->gtype_;
    uVar20 = (uint)GVar13;
    if ((uVar20 >> 0x14 & 1) == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (pSVar12->world).numTriangles;
    }
    if ((uVar20 >> 0x15 & 1) != 0) {
      uVar19 = uVar19 + (pSVar12->world).numQuads;
    }
    if ((GVar13 & MTY_CURVE2) != ~MTY_ALL) {
      uVar19 = uVar19 + (pSVar12->world).numLineSegments;
    }
    if ((GVar13 & MTY_CURVE4) != ~MTY_ALL) {
      uVar19 = uVar19 + (pSVar12->world).numBezierCurves;
    }
    if ((GVar13 & MTY_POINTS) != ~MTY_ALL) {
      uVar19 = uVar19 + (pSVar12->world).numPoints;
    }
    if ((uVar20 >> 0x17 & 1) != 0) {
      uVar19 = uVar19 + (pSVar12->world).numSubdivPatches;
    }
    if ((uVar20 >> 0x1d & 1) != 0) {
      uVar19 = uVar19 + (pSVar12->world).numUserGeometries;
    }
    if ((uVar20 >> 0x1e & 1) != 0) {
      uVar19 = uVar19 + (pSVar12->world).numInstancesCheap;
    }
    if ((int)uVar20 < 0) {
      uVar19 = uVar19 + (pSVar12->world).numInstancesExpensive;
    }
    if ((uVar20 >> 0x18 & 1) != 0) {
      uVar19 = uVar19 + (pSVar12->world).numInstanceArrays;
    }
    if ((uVar20 >> 0x16 & 1) != 0) {
      uVar19 = uVar19 + (pSVar12->world).numGrids;
    }
  }
  else {
    uVar19 = (ulong)pGVar11->numPrimitives;
  }
  this->numPreviousPrimitives = (uint)uVar19;
  this_00 = this->bvh;
  if (uVar19 == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar27 = (this->prims).size_alloced;
    pPVar9 = (this->prims).items;
    if (pPVar9 != (PrimRef *)0x0) {
      if (sVar27 << 5 < 0x1c00000) {
        alignedFree(pPVar9);
      }
      else {
        os_free(pPVar9,sVar27 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar27 != 0) {
      pMVar10 = (this->prims).alloc.device;
      (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
    }
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    if (pGVar11 == (Geometry *)0x0) {
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct((ulong)local_98,'\x01');
      *local_98[0] = 0x34;
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ffdf3e);
      local_108 = &local_f8;
      plVar21 = plVar17 + 2;
      if ((long *)*plVar17 == plVar21) {
        local_f8 = *plVar21;
        lStack_f0 = plVar17[3];
      }
      else {
        local_f8 = *plVar21;
        local_108 = (long *)*plVar17;
      }
      local_100 = plVar17[1];
      *plVar17 = (long)plVar21;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_e8._0_8_ = local_d8;
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 == paVar22) {
        local_d8[0]._0_8_ = paVar22->_M_allocated_capacity;
        local_d8[0]._8_8_ = plVar17[3];
      }
      else {
        local_d8[0]._0_8_ = paVar22->_M_allocated_capacity;
        local_e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar17;
      }
      local_e8._8_8_ = plVar17[1];
      *plVar17 = (long)paVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
    }
    else {
      local_e8._0_8_ = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    }
    t0 = BVHN<4>::preBuild(this_00,(string *)&local_e8.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (pGVar11 == (Geometry *)0x0) {
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
    if (this->primrefarrayalloc == true) {
      uVar23 = 0xffffffffffffffff;
      if (999999 < uVar19) {
        uVar23 = uVar19 / 1000;
      }
      (this->settings).primrefarrayalloc = uVar23;
    }
    if (this->mesh != (Geometry *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    auVar29._8_4_ = (int)(uVar19 >> 0x20);
    auVar29._0_8_ = uVar19;
    auVar29._12_4_ = 0x45300000;
    dVar14 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(uint)uVar19) - 4503599627370496.0)) * 1.2 * 8.0;
    uVar23 = (ulong)dVar14;
    sVar27 = ((long)(dVar14 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23) +
             (uVar19 * 0xe0 >> 4);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar27);
    sVar27 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,uVar19,sVar27);
    (this->settings).singleThreadThreshold = sVar27;
    uVar23 = (this->prims).size_alloced;
    uVar26 = uVar23;
    if ((uVar23 < uVar19) && (uVar26 = uVar19, uVar23 != 0)) {
      while (uVar26 = uVar23, uVar26 < uVar19) {
        uVar23 = uVar26 * 2 + (ulong)(uVar26 * 2 == 0);
      }
    }
    psVar1 = &(this->prims).size_active;
    if (uVar19 < (this->prims).size_active) {
      *psVar1 = uVar19;
    }
    prims = (EVP_PKEY_CTX *)&this->prims;
    if ((this->prims).size_alloced == uVar26) {
      *psVar1 = uVar19;
    }
    else {
      pPVar9 = (this->prims).items;
      if (uVar26 != 0) {
        pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar26 << 5,0);
      }
      sVar27 = uVar26 << 5;
      if (sVar27 < 0x1c00000) {
        pPVar18 = (PrimRef *)alignedMalloc(sVar27,0x20);
      }
      else {
        pPVar18 = (PrimRef *)os_malloc(sVar27,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar18;
      if ((this->prims).size_active != 0) {
        lVar16 = 0x10;
        uVar23 = 0;
        do {
          pPVar18 = (this->prims).items;
          puVar2 = (undefined8 *)((long)pPVar9 + lVar16 + -0x10);
          uVar15 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar18 + lVar16 + -0x10);
          *puVar3 = *puVar2;
          puVar3[1] = uVar15;
          puVar2 = (undefined8 *)((long)&(pPVar9->lower).field_0 + lVar16);
          uVar15 = puVar2[1];
          puVar3 = (undefined8 *)((long)&(pPVar18->lower).field_0 + lVar16);
          *puVar3 = *puVar2;
          puVar3[1] = uVar15;
          uVar23 = uVar23 + 1;
          lVar16 = lVar16 + 0x20;
        } while (uVar23 < (this->prims).size_active);
      }
      sVar27 = (this->prims).size_alloced;
      if (pPVar9 != (PrimRef *)0x0) {
        if (sVar27 << 5 < 0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,sVar27 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
      }
      (this->prims).size_active = uVar19;
      (this->prims).size_alloced = uVar26;
    }
    if (this->mesh == (Geometry *)0x0) {
      sse2::createPrimRefArray
                ((PrimInfo *)&local_e8.field_1,this->scene,this->gtype_,false,uVar19,
                 (mvector<PrimRef> *)prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      sse2::createPrimRefArray
                ((PrimInfo *)&local_e8.field_1,this->mesh,this->geomID_,uVar19,
                 (mvector<PrimRef> *)prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    local_78._8_8_ = this->bvh;
    if (local_a0 == local_a8) {
      (*(((BVH *)local_78._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
      sVar27 = (this->prims).size_alloced;
      pPVar9 = (this->prims).items;
      if (pPVar9 != (PrimRef *)0x0) {
        if (sVar27 << 5 < 0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,sVar27 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
      }
      *psVar1 = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
    }
    else {
      local_78._0_8_ = &PTR_createLeaf_02209db8;
      root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                       ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                        &(((BVH *)local_78._8_8_)->scene->progressInterface).
                         super_BuildProgressMonitor,(this->prims).items,
                        (PrimInfo *)&local_e8.field_1,this->settings);
      local_78._0_8_ = local_e8._0_8_;
      local_78._8_8_ = local_e8._8_8_;
      local_68._0_8_ = local_d8[0]._M_allocated_capacity;
      local_68._8_8_ = local_d8[0]._8_8_;
      local_58._0_8_ = local_e8._0_8_;
      local_58._8_8_ = local_e8._8_8_;
      local_48._0_8_ = local_d8[0]._M_allocated_capacity;
      local_48._8_8_ = local_d8[0]._8_8_;
      BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,local_a0 - local_a8);
      fVar28 = (float)(ulong)(local_a0 - local_a8) * 0.005;
      uVar19 = (ulong)fVar28;
      ctx = (EVP_PKEY_CTX *)((long)(fVar28 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
      BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
      if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
        if ((this->scene != (Scene *)0x0) &&
           ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
          sVar27 = (this->prims).size_alloced;
          pPVar9 = (this->prims).items;
          if (pPVar9 != (PrimRef *)0x0) {
            ctx = (EVP_PKEY_CTX *)(sVar27 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pPVar9);
            }
            else {
              os_free(pPVar9,(size_t)ctx,(this->prims).alloc.hugepages);
            }
          }
          if (sVar27 != 0) {
            pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
            ctx = (EVP_PKEY_CTX *)(sVar27 * -0x20);
            (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,ctx,1);
          }
          *psVar1 = 0;
          (this->prims).size_alloced = 0;
          (this->prims).items = (PrimRef *)0x0;
        }
      }
      else {
        FastAllocator::share(&this->bvh->alloc,(mvector<PrimRef> *)prims);
        ctx = prims;
      }
      BVHN<4>::cleanup(this->bvh,ctx);
      BVHN<4>::postBuild(this->bvh,t0);
    }
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            /* create primref array */
            if (primrefarrayalloc) {
              settings.primrefarrayalloc = numPrimitives/1000;
              if (settings.primrefarrayalloc < 1000)
                settings.primrefarrayalloc = inf;
            }

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* initialize allocator */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            prims.resize(numPrimitives);

            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
              createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* pinfo might has zero size due to invalid geometry */
            if (unlikely(pinfo.size() == 0))
            {
              bvh->clear();
              prims.clear();
              return;
            }

            /* call BVH builder */
            NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeaf<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

#if PROFILE
          });
#endif

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }